

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.h
# Opt level: O2

void __thiscall cbtUnionFind::unite(cbtUnionFind *this,int p,int q)

{
  cbtElement *pcVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = find(this,p);
  iVar3 = find(this,q);
  if (iVar2 != iVar3) {
    pcVar1 = (this->m_elements).m_data;
    pcVar1[iVar2].m_id = iVar3;
    pcVar1[iVar3].m_sz = pcVar1[iVar3].m_sz + pcVar1[iVar2].m_sz;
  }
  return;
}

Assistant:

void unite(int p, int q)
	{
		int i = find(p), j = find(q);
		if (i == j)
			return;

#ifndef USE_PATH_COMPRESSION
		//weighted quick union, this keeps the 'trees' balanced, and keeps performance of unite O( log(n) )
		if (m_elements[i].m_sz < m_elements[j].m_sz)
		{
			m_elements[i].m_id = j;
			m_elements[j].m_sz += m_elements[i].m_sz;
		}
		else
		{
			m_elements[j].m_id = i;
			m_elements[i].m_sz += m_elements[j].m_sz;
		}
#else
		m_elements[i].m_id = j;
		m_elements[j].m_sz += m_elements[i].m_sz;
#endif  //USE_PATH_COMPRESSION
	}